

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostCoordinator.hpp
# Opt level: O0

void __thiscall
memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>::free
          (HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>
           *this,void *__ptr)

{
  pointer pvVar1;
  size_type sVar2;
  Allocator<float,_memory::impl::AlignedPolicy<32UL>_> local_19;
  ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
  *pAStack_18;
  template_rebind<value_type> allocator;
  view_type *rng_local;
  HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_> *this_local;
  
  pAStack_18 = (ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
                *)__ptr;
  Allocator<float,_memory::impl::AlignedPolicy<32UL>_>::Allocator(&local_19);
  pvVar1 = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
           ::data(pAStack_18);
  if (pvVar1 != (pointer)0x0) {
    pvVar1 = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
             ::data(pAStack_18);
    sVar2 = ArrayViewImpl<memory::ArrayReference<float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>,_float,_memory::HostCoordinator<float,_memory::Allocator<float,_memory::impl::AlignedPolicy<32UL>_>_>_>
            ::size(pAStack_18);
    Allocator<float,_memory::impl::AlignedPolicy<32UL>_>::deallocate(&local_19,pvVar1,sVar2);
  }
  impl::
  reset<memory::ArrayReference<float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>,float,memory::HostCoordinator<float,memory::Allocator<float,memory::impl::AlignedPolicy<32ul>>>>
            (pAStack_18);
  Allocator<float,_memory::impl::AlignedPolicy<32UL>_>::~Allocator(&local_19);
  return;
}

Assistant:

void free(view_type& rng) {
        typename Allocator::template rebind<value_type> allocator;

        if(rng.data()) {
        #ifdef VERBOSE
            std::cerr << util::type_printer<HostCoordinator>::print()
                      << "::" + util::blue("free") << "(" << rng.size()
                      << " [" << rng.size()*sizeof(value_type) << " bytes])"
                      << " @ " << rng.data()
                      << std::endl;

        #endif

            allocator.deallocate(rng.data(), rng.size());
        }

        impl::reset(rng);
    }